

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mining.cpp
# Opt level: O0

RPCHelpMan * getnetworkhashps(void)

{
  initializer_list<RPCArg> __l;
  RPCHelpMan *in_RDI;
  undefined1 *puVar1;
  long in_FS_OFFSET;
  allocator<RPCArg> *in_stack_fffffffffffff798;
  RPCArg *this;
  UniValue *in_stack_fffffffffffff7a0;
  function<UniValue_(const_RPCHelpMan_&,_const_JSONRPCRequest_&)> *in_stack_fffffffffffff7a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff7b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff7c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff7d0;
  UniValue *in_stack_fffffffffffff7d8;
  iterator in_stack_fffffffffffff7e0;
  undefined1 *puVar2;
  RPCArgOptions *in_stack_fffffffffffff7e8;
  string *in_stack_fffffffffffff7f0;
  Fallback *in_stack_fffffffffffff7f8;
  undefined1 skip_type_check;
  vector<RPCResult,_std::allocator<RPCResult>_> *in_stack_fffffffffffff800;
  string *in_stack_fffffffffffff808;
  RPCArg *in_stack_fffffffffffff810;
  RPCResults *this_00;
  RPCResult *this_01;
  RPCExamples *in_stack_fffffffffffff8e0;
  pointer results;
  pointer args;
  pointer description;
  undefined8 in_stack_fffffffffffff900;
  undefined8 in_stack_fffffffffffff908;
  allocator<char> local_6d1 [7];
  allocator<char> local_6ca;
  allocator<char> local_6c9 [8];
  allocator<char> local_6c1 [31];
  allocator<char> local_6a2;
  allocator<char> local_6a1 [161];
  RPCMethodImpl *in_stack_fffffffffffffa00;
  undefined1 local_258 [528];
  undefined1 local_48 [64];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff7e8,(char *)in_stack_fffffffffffff7e0,
             (allocator<char> *)in_stack_fffffffffffff7d8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff7e8,(char *)in_stack_fffffffffffff7e0,
             (allocator<char> *)in_stack_fffffffffffff7d8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff7e8,(char *)in_stack_fffffffffffff7e0,
             (allocator<char> *)in_stack_fffffffffffff7d8);
  local_6c9[1] = (allocator<char>)0x78;
  local_6c9[2] = (allocator<char>)0x0;
  local_6c9[3] = (allocator<char>)0x0;
  local_6c9[4] = (allocator<char>)0x0;
  UniValue::UniValue<int,_int,_true>(in_stack_fffffffffffff7d8,(int *)in_stack_fffffffffffff7d0);
  std::variant<RPCArg::Optional,std::__cxx11::string,UniValue>::
  variant<UniValue,void,void,UniValue,void>
            ((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)in_stack_fffffffffffff7a8,in_stack_fffffffffffff7a0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff7e8,(char *)in_stack_fffffffffffff7e0,
             (allocator<char> *)in_stack_fffffffffffff7d8);
  std::__cxx11::string::string(in_stack_fffffffffffff7b0);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)in_stack_fffffffffffff798);
  RPCArg::RPCArg(in_stack_fffffffffffff810,in_stack_fffffffffffff808,
                 (Type)((ulong)in_stack_fffffffffffff800 >> 0x20),in_stack_fffffffffffff7f8,
                 in_stack_fffffffffffff7f0,in_stack_fffffffffffff7e8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff7e8,(char *)in_stack_fffffffffffff7e0,
             (allocator<char> *)in_stack_fffffffffffff7d8);
  local_6d1[1] = (allocator<char>)0xff;
  local_6d1[2] = (allocator<char>)0xff;
  local_6d1[3] = (allocator<char>)0xff;
  local_6d1[4] = (allocator<char>)0xff;
  UniValue::UniValue<int,_int,_true>(in_stack_fffffffffffff7d8,(int *)in_stack_fffffffffffff7d0);
  std::variant<RPCArg::Optional,std::__cxx11::string,UniValue>::
  variant<UniValue,void,void,UniValue,void>
            ((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)in_stack_fffffffffffff7a8,in_stack_fffffffffffff7a0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff7e8,(char *)in_stack_fffffffffffff7e0,
             (allocator<char> *)in_stack_fffffffffffff7d8);
  std::__cxx11::string::string(in_stack_fffffffffffff7b0);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)in_stack_fffffffffffff798);
  RPCArg::RPCArg(in_stack_fffffffffffff810,in_stack_fffffffffffff808,
                 (Type)((ulong)in_stack_fffffffffffff800 >> 0x20),in_stack_fffffffffffff7f8,
                 in_stack_fffffffffffff7f0,in_stack_fffffffffffff7e8);
  skip_type_check = (undefined1)((ulong)in_stack_fffffffffffff7f8 >> 0x38);
  std::allocator<RPCArg>::allocator(in_stack_fffffffffffff798);
  __l._M_len = (size_type)in_stack_fffffffffffff7e8;
  __l._M_array = in_stack_fffffffffffff7e0;
  std::vector<RPCArg,_std::allocator<RPCArg>_>::vector
            ((vector<RPCArg,_std::allocator<RPCArg>_> *)in_stack_fffffffffffff7d8,__l,
             (allocator_type *)in_stack_fffffffffffff7d0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff7e8,(char *)in_stack_fffffffffffff7e0,
             (allocator<char> *)in_stack_fffffffffffff7d8);
  this_01 = (RPCResult *)&stack0xfffffffffffff90e;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff7e8,(char *)in_stack_fffffffffffff7e0,
             (allocator<char> *)in_stack_fffffffffffff7d8);
  results = (pointer)0x0;
  args = (pointer)0x0;
  description = (pointer)0x0;
  this_00 = (RPCResults *)&stack0xfffffffffffff8e8;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_fffffffffffff798);
  RPCResult::RPCResult
            (this_01,(Type)((ulong)this_00 >> 0x20),&in_stack_fffffffffffff810->m_names,
             in_stack_fffffffffffff808,in_stack_fffffffffffff800,(bool)skip_type_check);
  RPCResults::RPCResults(this_00,(RPCResult *)in_stack_fffffffffffff810);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff7e8,(char *)in_stack_fffffffffffff7e0,
             (allocator<char> *)in_stack_fffffffffffff7d8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff7e8,(char *)in_stack_fffffffffffff7e0,
             (allocator<char> *)in_stack_fffffffffffff7d8);
  HelpExampleCli(in_stack_fffffffffffff7d0,in_stack_fffffffffffff7c8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff7e8,(char *)in_stack_fffffffffffff7e0,
             (allocator<char> *)in_stack_fffffffffffff7d8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff7e8,(char *)in_stack_fffffffffffff7e0,
             (allocator<char> *)in_stack_fffffffffffff7d8);
  HelpExampleRpc(in_stack_fffffffffffff7d0,in_stack_fffffffffffff7c8);
  std::operator+(in_stack_fffffffffffff7d0,in_stack_fffffffffffff7c8);
  RPCExamples::RPCExamples((RPCExamples *)in_stack_fffffffffffff798,(string *)0x131a33f);
  this = (RPCArg *)&stack0xfffffffffffff8c0;
  std::function<UniValue(RPCHelpMan_const&,JSONRPCRequest_const&)>::
  function<getnetworkhashps()::__0,void>
            (in_stack_fffffffffffff7a8,(anon_class_1_0_00000001 *)in_stack_fffffffffffff7a0);
  RPCHelpMan::RPCHelpMan
            ((RPCHelpMan *)in_stack_fffffffffffff908,(string *)in_stack_fffffffffffff900,
             &description->m_names,(vector<RPCArg,_std::allocator<RPCArg>_> *)args,
             (RPCResults *)results,in_stack_fffffffffffff8e0,in_stack_fffffffffffffa00);
  std::function<UniValue_(const_RPCHelpMan_&,_const_JSONRPCRequest_&)>::~function
            ((function<UniValue_(const_RPCHelpMan_&,_const_JSONRPCRequest_&)> *)this);
  RPCExamples::~RPCExamples((RPCExamples *)this);
  std::__cxx11::string::~string(&this->m_names);
  std::__cxx11::string::~string(&this->m_names);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xfffffffffffff8e4);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xfffffffffffff8e5);
  std::__cxx11::string::~string(&this->m_names);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xfffffffffffff8e6);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xfffffffffffff8e7);
  RPCResults::~RPCResults((RPCResults *)this);
  RPCResult::~RPCResult((RPCResult *)this);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_fffffffffffff7a8);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xfffffffffffff90e);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xfffffffffffff90f);
  std::vector<RPCArg,_std::allocator<RPCArg>_>::~vector
            ((vector<RPCArg,_std::allocator<RPCArg>_> *)in_stack_fffffffffffff7a8);
  std::allocator<RPCArg>::~allocator((allocator<RPCArg> *)this);
  puVar2 = local_258;
  puVar1 = local_48;
  do {
    puVar1 = puVar1 + -0x108;
    RPCArg::~RPCArg(this);
  } while (puVar1 != puVar2);
  RPCArgOptions::~RPCArgOptions((RPCArgOptions *)this);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(local_6d1);
  std::
  variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  ::~variant((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)this);
  UniValue::~UniValue((UniValue *)this);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_6ca);
  RPCArgOptions::~RPCArgOptions((RPCArgOptions *)this);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(local_6c9);
  std::
  variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  ::~variant((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)this);
  UniValue::~UniValue((UniValue *)this);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(local_6c1);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_6a2);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(local_6a1);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

static RPCHelpMan getnetworkhashps()
{
    return RPCHelpMan{"getnetworkhashps",
                "\nReturns the estimated network hashes per second based on the last n blocks.\n"
                "Pass in [blocks] to override # of blocks, -1 specifies since last difficulty change.\n"
                "Pass in [height] to estimate the network speed at the time when a certain block was found.\n",
                {
                    {"nblocks", RPCArg::Type::NUM, RPCArg::Default{120}, "The number of previous blocks to calculate estimate from, or -1 for blocks since last difficulty change."},
                    {"height", RPCArg::Type::NUM, RPCArg::Default{-1}, "To estimate at the time of the given height."},
                },
                RPCResult{
                    RPCResult::Type::NUM, "", "Hashes per second estimated"},
                RPCExamples{
                    HelpExampleCli("getnetworkhashps", "")
            + HelpExampleRpc("getnetworkhashps", "")
                },
        [&](const RPCHelpMan& self, const JSONRPCRequest& request) -> UniValue
{
    ChainstateManager& chainman = EnsureAnyChainman(request.context);
    LOCK(cs_main);
    return GetNetworkHashPS(self.Arg<int>("nblocks"), self.Arg<int>("height"), chainman.ActiveChain());
},
    };
}